

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint _c;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  Allocator *pAVar9;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float *pfVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  iVar3 = bottom_blob->w;
  iVar4 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar11 = (ulong)_c;
  sVar5 = bottom_blob->elemsize;
  Mat::create(top_blob,iVar3,iVar4,_c,sVar5,opt->blob_allocator);
  pvVar12 = top_blob->data;
  if (pvVar12 == (void *)0x0) {
    return -100;
  }
  sVar6 = top_blob->cstep;
  if ((long)top_blob->c * sVar6 == 0) {
    return -100;
  }
  uVar20 = iVar4 * iVar3;
  iVar3 = this->across_spatial;
  iVar4 = this->across_channel;
  if (iVar4 == 0 || iVar3 == 0) {
    if (iVar3 != 0 && iVar4 == 0) {
      if ((int)_c < 1) {
        return 0;
      }
      pvVar13 = bottom_blob->data;
      sVar5 = bottom_blob->cstep;
      iVar3 = this->channel_shared;
      sVar7 = bottom_blob->elemsize;
      sVar8 = top_blob->elemsize;
      uVar15 = 0;
      do {
        if (0 < (int)uVar20) {
          fVar22 = this->eps;
          uVar18 = 0;
          do {
            fVar21 = *(float *)((long)pvVar13 + uVar18 * 4);
            fVar22 = fVar22 + fVar21 * fVar21;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
          if (0 < (int)uVar20) {
            auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar22));
            fVar21 = auVar23._0_4_;
            uVar18 = 0;
            if (iVar3 == 0) {
              uVar18 = uVar15;
            }
            fVar2 = *(float *)((long)(this->scale_data).data + uVar18 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar12 + uVar18 * 4) =
                   *(float *)((long)pvVar13 + uVar18 * 4) * fVar2 *
                   fVar21 * -0.5 * (fVar22 * fVar21 * fVar21 + -3.0);
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
        }
        uVar15 = uVar15 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar7);
        pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar8);
      } while (uVar15 != uVar11);
      return 0;
    }
    if (iVar4 == 0 || iVar3 != 0) {
      return 0;
    }
    pAVar9 = opt->workspace_allocator;
    if (uVar20 == 0) {
      return -100;
    }
    uVar15 = sVar5 * (long)(int)uVar20 + 3 & 0xfffffffffffffffc;
    if (pAVar9 == (Allocator *)0x0) {
      pvVar12 = malloc(uVar15 + 0x1c);
      uVar18 = (long)pvVar12 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar18 - 8) = pvVar12;
    }
    else {
      uVar18 = (*(code *)**(undefined8 **)pAVar9)(pAVar9,uVar15 + 4);
    }
    piVar1 = (int *)(uVar18 + uVar15);
    *(undefined4 *)(uVar18 + uVar15) = 1;
    if (this->channel_shared == 0) {
      if (0 < (int)uVar20) {
        pfVar14 = (float *)bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          fVar22 = this->eps;
          uVar17 = uVar11;
          pfVar19 = pfVar14;
          if (0 < (int)_c) {
            do {
              fVar22 = fVar22 + *pfVar19 * *pfVar19;
              pfVar19 = (float *)((long)pfVar19 + sVar5 * sVar6);
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar22));
          fVar21 = auVar23._0_4_;
          *(float *)(uVar18 + uVar15 * 4) = fVar21 * -0.5 * (fVar22 * fVar21 * fVar21 + -3.0);
          uVar15 = uVar15 + 1;
          pfVar14 = pfVar14 + 1;
        } while (uVar15 != uVar20);
      }
      if (0 < (int)_c) {
        pvVar12 = bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        pvVar13 = top_blob->data;
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        pvVar10 = (this->scale_data).data;
        sVar8 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          if (0 < (int)uVar20) {
            fVar22 = *(float *)((long)pvVar10 + uVar15 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar12 + uVar17 * 4) * fVar22 * *(float *)(uVar18 + uVar17 * 4)
              ;
              uVar17 = uVar17 + 1;
            } while (uVar20 != uVar17);
          }
          uVar15 = uVar15 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
          pvVar12 = (void *)((long)pvVar12 + sVar5 * sVar8);
        } while (uVar15 != uVar11);
      }
    }
    else {
      if (0 < (int)uVar20) {
        fVar22 = *(this->scale_data).data;
        pfVar14 = (float *)bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          auVar23 = ZEXT416((uint)this->eps);
          uVar17 = uVar11;
          pfVar19 = pfVar14;
          if (0 < (int)_c) {
            do {
              auVar23._0_4_ = auVar23._0_4_ + *pfVar19 * *pfVar19;
              pfVar19 = (float *)((long)pfVar19 + sVar5 * sVar6);
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          auVar24 = rsqrtss(ZEXT816(0),auVar23);
          fVar21 = auVar24._0_4_;
          *(float *)(uVar18 + uVar15 * 4) =
               fVar21 * -0.5 * fVar22 * (auVar23._0_4_ * fVar21 * fVar21 + -3.0);
          uVar15 = uVar15 + 1;
          pfVar14 = pfVar14 + 1;
        } while (uVar15 != uVar20);
      }
      if (0 < (int)_c) {
        pvVar12 = bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        pvVar13 = top_blob->data;
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        sVar8 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          if (0 < (int)uVar20) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)(uVar18 + uVar17 * 4) * *(float *)((long)pvVar12 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar20 != uVar17);
          }
          uVar15 = uVar15 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
          pvVar12 = (void *)((long)pvVar12 + sVar5 * sVar8);
        } while (uVar15 != uVar11);
      }
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return 0;
    }
    if (pAVar9 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar9 + 8))();
      return 0;
    }
  }
  else {
    pAVar9 = opt->workspace_allocator;
    if (_c == 0) {
      return -100;
    }
    uVar15 = sVar5 * (long)(int)_c + 3 & 0xfffffffffffffffc;
    if (pAVar9 == (Allocator *)0x0) {
      pvVar12 = malloc(uVar15 + 0x1c);
      uVar18 = (long)pvVar12 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar18 - 8) = pvVar12;
    }
    else {
      uVar18 = (*(code *)**(undefined8 **)pAVar9)(pAVar9,uVar15 + 4);
    }
    piVar1 = (int *)(uVar18 + uVar15);
    *(undefined4 *)(uVar18 + uVar15) = 1;
    uVar15 = (ulong)uVar20;
    if ((int)_c < 1) {
      fVar22 = this->eps;
    }
    else {
      pvVar12 = bottom_blob->data;
      sVar5 = bottom_blob->cstep;
      sVar6 = bottom_blob->elemsize;
      uVar17 = 0;
      do {
        fVar22 = 0.0;
        if (0 < (int)uVar20) {
          uVar16 = 0;
          do {
            fVar21 = *(float *)((long)pvVar12 + uVar16 * 4);
            fVar22 = fVar22 + fVar21 * fVar21;
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        *(float *)(uVar18 + uVar17 * 4) = fVar22;
        uVar17 = uVar17 + 1;
        pvVar12 = (void *)((long)pvVar12 + sVar5 * sVar6);
      } while (uVar17 != uVar11);
      fVar22 = this->eps;
      if (0 < (int)_c) {
        uVar17 = 0;
        do {
          fVar22 = fVar22 + *(float *)(uVar18 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
    }
    auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar22));
    fVar21 = auVar23._0_4_;
    fVar22 = fVar21 * -0.5 * (fVar22 * fVar21 * fVar21 + -3.0);
    if (this->channel_shared == 0) {
      if (0 < (int)_c) {
        pvVar12 = bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        pvVar13 = top_blob->data;
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        pvVar10 = (this->scale_data).data;
        sVar8 = bottom_blob->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar20) {
            fVar21 = *(float *)((long)pvVar10 + uVar17 * 4);
            uVar16 = 0;
            do {
              *(float *)((long)pvVar13 + uVar16 * 4) =
                   *(float *)((long)pvVar12 + uVar16 * 4) * fVar21 * fVar22;
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
          pvVar12 = (void *)((long)pvVar12 + sVar5 * sVar8);
        } while (uVar17 != uVar11);
      }
    }
    else if (0 < (int)_c) {
      fVar21 = *(this->scale_data).data;
      pvVar12 = bottom_blob->data;
      sVar5 = bottom_blob->cstep;
      sVar6 = top_blob->cstep;
      sVar7 = top_blob->elemsize;
      pvVar13 = top_blob->data;
      sVar8 = bottom_blob->elemsize;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar16 = 0;
          do {
            *(float *)((long)pvVar13 + uVar16 * 4) =
                 *(float *)((long)pvVar12 + uVar16 * 4) * fVar22 * fVar21;
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
        pvVar12 = (void *)((long)pvVar12 + sVar5 * sVar8);
      } while (uVar17 != uVar11);
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return 0;
    }
    if (pAVar9 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar9 + 8))();
      return 0;
    }
  }
  if (uVar18 != 0) {
    free(*(void **)(uVar18 - 8));
    return 0;
  }
  return 0;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}